

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer_tests.cpp
# Opt level: O3

void check_remove(json *example,string *path,json *expected)

{
  Flags resultDisposition;
  int iVar1;
  AssertionHandler catchAssertionHandler;
  error_code ec;
  SourceLineInfo local_e8;
  AssertionHandler local_d8;
  ITransientExpression local_90;
  json *local_80;
  char *local_78;
  size_t sStack_70;
  json *local_68;
  StringRef local_60;
  StringRef local_50;
  error_code local_40;
  
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::jsonpointer::
  remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string>
            (example,path,&local_40);
  local_90._vptr_ITransientExpression = (_func_int **)0x7f966c;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
  ;
  local_e8.line = 0x47;
  Catch::StringRef::StringRef(&local_50,"ec");
  resultDisposition = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_90,&local_e8,local_50,resultDisposition);
  local_90._vptr_ITransientExpression = (_func_int **)&local_40;
  Catch::AssertionHandler::handleExpr<std::error_code_const&>
            (&local_d8,(ExprLhs<const_std::error_code_&> *)&local_90);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_90._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
  ;
  local_e8.line = 0x48;
  Catch::StringRef::StringRef(&local_60,"expected == example");
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,(StringRef *)&local_90,&local_e8,local_60,ContinueOnFailure);
  iVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (expected,example);
  Catch::StringRef::StringRef((StringRef *)&local_e8,"==");
  local_90.m_result = iVar1 == 0;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30630;
  local_78 = local_e8.file;
  sStack_70 = local_e8.line;
  local_80 = expected;
  local_68 = example;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void check_remove(json& example, const std::string& path, const json& expected)
{
    std::error_code ec;
    jsonpointer::remove(example, path, ec);
    CHECK_FALSE(ec);
    CHECK(expected == example);
}